

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::InPlaceOperator__(void *this,InPlaceOperator *o)

{
  byte bVar1;
  byte bVar2;
  Expression *pEVar3;
  bool oldReading;
  bool oldWriting;
  InPlaceOperator *o_local;
  UseCounter *this_local;
  
  bVar1 = *(byte *)((long)this + 9);
  bVar2 = *(byte *)((long)this + 8);
  *(undefined1 *)((long)this + 8) = 1;
  *(undefined1 *)((long)this + 9) = 1;
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&o->target);
  (**(code **)(*this + 0x18))(this,pEVar3);
  *(byte *)((long)this + 9) = bVar1 & 1;
  *(byte *)((long)this + 8) = bVar2 & 1;
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&o->source);
  (**(code **)(*this + 0x18))(this,pEVar3);
  return;
}

Assistant:

void visit (AST::InPlaceOperator& o) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = true;
                isWriting = true;
                visitObject (o.target);
                isWriting = oldWriting;
                isReading = oldReading;
                visitObject (o.source);
            }